

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

void duckdb::ConstructSortKeyList<duckdb::SortKeyListEntry>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  value_type vVar1;
  bool bVar2;
  undefined1 uVar3;
  long in_RSI;
  long in_RDI;
  ulong in_stack_00000008;
  ulong in_stack_00000010;
  SortKeyChunk child_chunk;
  list_entry_t list_entry;
  data_ptr_t result_ptr;
  value_type *offset;
  idx_t idx;
  idx_t result_index;
  idx_t r;
  unsafe_vector<idx_t> *offsets;
  SortKeyConstructInfo *in_stack_00000248;
  SortKeyVectorData *in_stack_00000250;
  SortKeyChunk in_stack_00000260;
  idx_t in_stack_ffffffffffffff48;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  *in_stack_ffffffffffffff50;
  SortKeyVectorData *in_stack_ffffffffffffff58;
  SortKeyChunk local_70;
  list_entry_t local_50;
  long local_40;
  reference local_38;
  idx_t local_30;
  idx_t local_28;
  ulong local_20;
  undefined8 local_18;
  long local_10;
  long local_8;
  
  local_18 = *(undefined8 *)(in_RSI + 8);
  local_20 = in_stack_00000008;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    if (in_stack_00000010 <= local_20) {
      return;
    }
    local_28 = SortKeyChunk::GetResultIndex((SortKeyChunk *)&stack0x00000008,local_20);
    local_30 = SelectionVector::get_index(*(SelectionVector **)(local_8 + 0x10),local_20);
    local_38 = vector<unsigned_long,_false>::operator[]
                         ((vector<unsigned_long,_false> *)in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff48);
    local_40 = *(long *)(*(long *)(local_10 + 0x10) + local_28 * 8);
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff58,
                       (idx_t)in_stack_ffffffffffffff50);
    if (bVar2) {
      uVar3 = *(undefined1 *)(local_8 + 0x71);
      vVar1 = *local_38;
      *local_38 = vVar1 + 1;
      *(undefined1 *)(local_40 + vVar1) = uVar3;
LAB_013fa130:
      local_50 = SortKeyListEntry::GetListEntry
                           (in_stack_ffffffffffffff58,(idx_t)in_stack_ffffffffffffff50);
      if (local_50.length != 0) {
        SortKeyChunk::SortKeyChunk
                  (&local_70,local_50.offset,local_50.offset + local_50.length,local_28);
        vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
        ::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
        ::operator*((unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                     *)in_stack_ffffffffffffff50);
        in_stack_ffffffffffffff48 = local_70.start;
        in_stack_ffffffffffffff50 =
             (vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
              *)local_70.end;
        in_stack_ffffffffffffff58 = (SortKeyVectorData *)local_70.result_index;
        ConstructSortKeyRecursive(in_stack_00000250,in_stack_00000260,in_stack_00000248);
      }
      uVar3 = 0;
      if ((*(byte *)(local_10 + 0x18) & 1) != 0) {
        uVar3 = 0xff;
      }
      vVar1 = *local_38;
      *local_38 = vVar1 + 1;
      *(undefined1 *)(local_40 + vVar1) = uVar3;
    }
    else {
      uVar3 = *(undefined1 *)(local_8 + 0x70);
      vVar1 = *local_38;
      *local_38 = vVar1 + 1;
      *(undefined1 *)(local_40 + vVar1) = uVar3;
      bVar2 = SortKeyListEntry::IsArray();
      if (bVar2) goto LAB_013fa130;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void ConstructSortKeyList(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
			if (!OP::IsArray()) {
				// for arrays we always write the child elements - also if the top-level array is NULL
				continue;
			}
		} else {
			// valid value - write the validity byte
			result_ptr[offset++] = vector_data.valid_byte;
		}

		auto list_entry = OP::GetListEntry(vector_data, idx);
		// recurse and write the list elements
		if (list_entry.length > 0) {
			SortKeyChunk child_chunk(list_entry.offset, list_entry.offset + list_entry.length, result_index);
			ConstructSortKeyRecursive(*vector_data.child_data[0], child_chunk, info);
		}

		// write the end-of-list delimiter
		result_ptr[offset++] = static_cast<data_t>(info.flip_bytes ? ~SortKeyVectorData::LIST_DELIMITER
		                                                           : SortKeyVectorData::LIST_DELIMITER);
	}
}